

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O1

string * __thiscall
uint256_tests::ArrayToString_abi_cxx11_
          (string *__return_storage_ptr__,uint256_tests *this,uchar *A,uint width)

{
  long lVar1;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  stringstream Stream;
  stringstream local_1c0 [16];
  long local_1b0 [2];
  undefined8 uStack_1a0;
  uint auStack_198 [22];
  ios_base local_140 [112];
  char acStack_d0 [152];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_1c0);
  *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
       *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffffb5 | 8;
  if ((int)A != 0) {
    uVar3 = (ulong)A & 0xffffffff;
    do {
      *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 2;
      lVar1 = *(long *)(local_1b0[0] + -0x18);
      if (acStack_d0[lVar1 + 1] == '\0') {
        cVar2 = std::ios::widen((char)local_1b0 + (char)lVar1);
        acStack_d0[lVar1] = cVar2;
        acStack_d0[lVar1 + 1] = '\x01';
      }
      acStack_d0[lVar1] = '0';
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string ArrayToString(const unsigned char A[], unsigned int width)
{
    std::stringstream Stream;
    Stream << std::hex;
    for (unsigned int i = 0; i < width; ++i)
    {
        Stream<<std::setw(2)<<std::setfill('0')<<(unsigned int)A[width-i-1];
    }
    return Stream.str();
}